

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::IsIPOEnabled(cmGeneratorTarget *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  _Base_ptr __s;
  bool bVar2;
  uint uVar3;
  cmake *pcVar4;
  ostream *poVar5;
  string *psVar6;
  PolicyID id;
  bool local_3da;
  undefined1 local_3b0 [24];
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  _Base_ptr local_2f8;
  char *message;
  string local_2e0;
  string local_2c0;
  undefined1 local_2a0 [8];
  ostringstream w;
  undefined1 local_120 [7];
  bool in_try_compile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  PolicyStatus local_e0;
  byte local_db;
  byte local_da;
  allocator<char> local_d9;
  PolicyStatus cmp0069;
  string_view local_b8;
  allocator<char> local_a1;
  string local_a0;
  string_view local_80;
  _Base_ptr local_70;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue feature;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  
  feature.Value = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"INTERPROCEDURAL_OPTIMIZATION",&local_51);
  local_30 = GetFeature(this,&local_50,feature.Value);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70 = (_Base_ptr)local_30.Value;
  bVar2 = cmIsOn(local_30);
  if (bVar2) {
    bVar2 = std::operator!=(lang,"C");
    if ((((bVar2) && (bVar2 = std::operator!=(lang,"CXX"), bVar2)) &&
        (bVar2 = std::operator!=(lang,"CUDA"), bVar2)) &&
       (bVar2 = std::operator!=(lang,"Fortran"), bVar2)) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = std::operator==(lang,"CUDA");
      if (bVar2) {
        std::allocator<char>::allocator();
        local_da = 0;
        local_db = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"CUDA_ARCHITECTURES",&local_a1);
        psVar6 = GetSafeProperty(this,&local_a0);
        local_80 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
        bVar2 = cmIsOff(local_80);
        local_3da = true;
        if (!bVar2) {
          std::allocator<char>::allocator();
          local_da = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmp0069,"CUDA_SEPARABLE_COMPILATION",&local_d9);
          local_db = 1;
          psVar6 = GetSafeProperty(this,(string *)&cmp0069);
          local_b8 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
          local_3da = cmIsOff(local_b8);
        }
        if ((local_db & 1) != 0) {
          std::__cxx11::string::~string((string *)&cmp0069);
        }
        if ((local_da & 1) != 0) {
          std::allocator<char>::~allocator(&local_d9);
        }
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator(&local_a1);
        if (local_3da != false) {
          return false;
        }
      }
      local_e0 = GetPolicyStatusCMP0069(this);
      if ((local_e0 == OLD) || (local_e0 == WARN)) {
        pcVar1 = this->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120,"_CMAKE_",lang);
        std::operator+(&local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120,"_IPO_LEGACY_BEHAVIOR");
        bVar2 = cmMakefile::IsOn(pcVar1,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)local_120);
        if (bVar2) {
          this_local._7_1_ = true;
        }
        else if ((this->PolicyReportedCMP0069 & 1U) == 0) {
          pcVar4 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
          bVar2 = cmake::GetIsInTryCompile(pcVar4);
          if ((local_e0 == WARN) && (!bVar2)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2c0,(cmPolicies *)0x45,id);
            poVar5 = std::operator<<((ostream *)local_2a0,(string *)&local_2c0);
            std::operator<<(poVar5,"\n");
            std::__cxx11::string::~string((string *)&local_2c0);
            poVar5 = std::operator<<((ostream *)local_2a0,
                                     "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
                                    );
            poVar5 = std::operator<<(poVar5,"\'");
            psVar6 = GetName_abi_cxx11_(this);
            poVar5 = std::operator<<(poVar5,(string *)psVar6);
            std::operator<<(poVar5,"\'.");
            pcVar4 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
            std::__cxx11::ostringstream::str();
            GetBacktrace((cmGeneratorTarget *)&message);
            cmake::IssueMessage(pcVar4,AUTHOR_WARNING,&local_2e0,(cmListFileBacktrace *)&message);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&message);
            std::__cxx11::string::~string((string *)&local_2e0);
            this->PolicyReportedCMP0069 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
          }
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        local_2f8 = (_Base_ptr)0x0;
        pcVar1 = this->Makefile;
        std::operator+(&local_338,"_CMAKE_",lang);
        std::operator+(&local_318,&local_338,"_IPO_SUPPORTED_BY_CMAKE");
        bVar2 = cmMakefile::IsOn(pcVar1,&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_338);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          pcVar1 = this->Makefile;
          std::operator+(&local_378,"_CMAKE_",lang);
          std::operator+(&local_358,&local_378,"_IPO_MAY_BE_SUPPORTED_BY_COMPILER");
          bVar2 = cmMakefile::IsOn(pcVar1,&local_358);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)&local_378);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            uVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2d])();
            if ((uVar3 & 1) == 0) {
              local_2f8 = (_Base_ptr)0xc8a9f4;
            }
          }
          else {
            local_2f8 = (_Base_ptr)0xc8a9d7;
          }
        }
        else {
          local_2f8 = (_Base_ptr)0xc8a986;
        }
        if (local_2f8 == (_Base_ptr)0x0) {
          this_local._7_1_ = true;
        }
        else if ((this->PolicyReportedCMP0069 & 1U) == 0) {
          this->PolicyReportedCMP0069 = true;
          pcVar4 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
          __s = local_2f8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_398,(char *)__s,(allocator<char> *)(local_3b0 + 0x17));
          GetBacktrace((cmGeneratorTarget *)local_3b0);
          cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_398,(cmListFileBacktrace *)local_3b0);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_3b0);
          std::__cxx11::string::~string((string *)&local_398);
          std::allocator<char>::~allocator((allocator<char> *)(local_3b0 + 0x17));
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::IsIPOEnabled(std::string const& lang,
                                     std::string const& config) const
{
  cmValue feature = this->GetFeature("INTERPROCEDURAL_OPTIMIZATION", config);

  if (!cmIsOn(feature)) {
    // 'INTERPROCEDURAL_OPTIMIZATION' is off, no need to check policies
    return false;
  }

  if (lang != "C" && lang != "CXX" && lang != "CUDA" && lang != "Fortran") {
    // We do not define IPO behavior for other languages.
    return false;
  }

  if (lang == "CUDA") {
    // CUDA IPO requires both CUDA_ARCHITECTURES and CUDA_SEPARABLE_COMPILATION
    if (cmIsOff(this->GetSafeProperty("CUDA_ARCHITECTURES")) ||
        cmIsOff(this->GetSafeProperty("CUDA_SEPARABLE_COMPILATION"))) {
      return false;
    }
  }

  cmPolicies::PolicyStatus cmp0069 = this->GetPolicyStatusCMP0069();

  if (cmp0069 == cmPolicies::OLD || cmp0069 == cmPolicies::WARN) {
    if (this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_LEGACY_BEHAVIOR")) {
      return true;
    }
    if (this->PolicyReportedCMP0069) {
      // problem is already reported, no need to issue a message
      return false;
    }
    const bool in_try_compile =
      this->LocalGenerator->GetCMakeInstance()->GetIsInTryCompile();
    if (cmp0069 == cmPolicies::WARN && !in_try_compile) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0069) << "\n";
      w << "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
        << "'" << this->GetName() << "'.";
      this->LocalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, w.str(), this->GetBacktrace());

      this->PolicyReportedCMP0069 = true;
    }
    return false;
  }

  // Note: check consistency with messages from CheckIPOSupported
  const char* message = nullptr;
  if (!this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_SUPPORTED_BY_CMAKE")) {
    message = "CMake doesn't support IPO for current compiler";
  } else if (!this->Makefile->IsOn("_CMAKE_" + lang +
                                   "_IPO_MAY_BE_SUPPORTED_BY_COMPILER")) {
    message = "Compiler doesn't support IPO";
  } else if (!this->GlobalGenerator->IsIPOSupported()) {
    message = "CMake doesn't support IPO for current generator";
  }

  if (!message) {
    // No error/warning messages
    return true;
  }

  if (this->PolicyReportedCMP0069) {
    // problem is already reported, no need to issue a message
    return false;
  }

  this->PolicyReportedCMP0069 = true;

  this->LocalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, message, this->GetBacktrace());
  return false;
}